

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strncpy_s.c
# Opt level: O0

errno_t strncpy_s(char *dest,rsize_t dmax,char *src,rsize_t slen)

{
  ulong in_RCX;
  char *in_RDX;
  char *in_RSI;
  char *in_RDI;
  char *overlap_bumper;
  char *orig_dest;
  rsize_t orig_dmax;
  undefined4 in_stack_ffffffffffffffb8;
  errno_t in_stack_ffffffffffffffbc;
  char *in_stack_ffffffffffffffc0;
  ulong local_28;
  char *local_20;
  char *local_18;
  char *local_10;
  errno_t local_4;
  
  if (in_RDI == (char *)0x0) {
    invoke_safe_str_constraint_handler
              (in_stack_ffffffffffffffc0,
               (void *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),0);
    local_4 = 400;
  }
  else if (in_RSI == (char *)0x0) {
    invoke_safe_str_constraint_handler
              (in_stack_ffffffffffffffc0,
               (void *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),0);
    local_4 = 0x191;
  }
  else if (in_RSI < (char *)0x1001) {
    if (in_RDX == (char *)0x0) {
      handle_error(in_RSI,(rsize_t)in_RDI,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
      local_4 = 400;
    }
    else if (in_RCX == 0) {
      handle_error(in_RSI,(rsize_t)in_RDI,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
      local_4 = 0x191;
    }
    else if (in_RCX < 0x1001) {
      local_28 = in_RCX;
      local_20 = in_RDX;
      local_18 = in_RSI;
      local_10 = in_RDI;
      if (in_RDI < in_RDX) {
        for (; local_18 != (char *)0x0; local_18 = local_18 + -1) {
          if (local_10 == in_RDX) {
            handle_error(in_RSI,(rsize_t)in_RDI,in_RDX,in_stack_ffffffffffffffbc);
            return 0x194;
          }
          if (local_28 == 0) {
            *local_10 = '\0';
            return 0;
          }
          *local_10 = *local_20;
          if (*local_10 == '\0') {
            return 0;
          }
          local_28 = local_28 - 1;
          local_10 = local_10 + 1;
          local_20 = local_20 + 1;
        }
      }
      else {
        for (; in_RDX = in_RDI, local_18 != (char *)0x0; local_18 = local_18 + -1) {
          if (local_20 == in_RDI) {
            handle_error(in_RSI,(rsize_t)in_RDI,in_RDI,in_stack_ffffffffffffffbc);
            return 0x194;
          }
          if (local_28 == 0) {
            *local_10 = '\0';
            return 0;
          }
          *local_10 = *local_20;
          if (*local_10 == '\0') {
            return 0;
          }
          local_28 = local_28 - 1;
          local_10 = local_10 + 1;
          local_20 = local_20 + 1;
        }
      }
      handle_error(in_RSI,(rsize_t)in_RDI,in_RDX,in_stack_ffffffffffffffbc);
      local_4 = 0x196;
    }
    else {
      handle_error(in_RSI,(rsize_t)in_RDI,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
      local_4 = 0x193;
    }
  }
  else {
    invoke_safe_str_constraint_handler
              (in_stack_ffffffffffffffc0,
               (void *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),0);
    local_4 = 0x193;
  }
  return local_4;
}

Assistant:

errno_t
strncpy_s (char *dest, rsize_t dmax, const char *src, rsize_t slen)
{
    rsize_t orig_dmax;
    char *orig_dest;
    const char *overlap_bumper;

    if (dest == NULL) {
        invoke_safe_str_constraint_handler("strncpy_s: dest is null",
                   NULL, ESNULLP);
        return RCNEGATE(ESNULLP);
    }

    if (dmax == 0) {
        invoke_safe_str_constraint_handler("strncpy_s: dmax is 0",
                   NULL, ESZEROL);
        return RCNEGATE(ESZEROL);
    }

    if (dmax > RSIZE_MAX_STR) {
        invoke_safe_str_constraint_handler("strncpy_s: dmax exceeds max",
                   NULL, ESLEMAX);
        return RCNEGATE(ESLEMAX);
    }

    /* hold base in case src was not copied */
    orig_dmax = dmax;
    orig_dest = dest;

    if (src == NULL) {
        handle_error(orig_dest, orig_dmax, "strncpy_s: "
                     "src is null",
                     ESNULLP);
        return RCNEGATE(ESNULLP);
    }

    if (slen == 0) {
        handle_error(orig_dest, orig_dmax, "strncpy_s: "
                     "slen is zero",
                     ESZEROL);
        return RCNEGATE(ESZEROL);
    }

    if (slen > RSIZE_MAX_STR) {
        handle_error(orig_dest, orig_dmax, "strncpy_s: "
                     "slen exceeds max",
                     ESLEMAX);
        return RCNEGATE(ESLEMAX);
    }


   if (dest < src) {
       overlap_bumper = src;

        while (dmax > 0) {
            if (dest == overlap_bumper) {
                handle_error(orig_dest, orig_dmax, "strncpy_s: "
                        "overlapping objects",
                        ESOVRLP);
                return RCNEGATE(ESOVRLP);
            }

	    if (slen == 0) {
                /*
                 * Copying truncated to slen chars.  Note that the TR says to
                 * copy slen chars plus the null char.  We null the slack.
                 */
#ifdef SAFECLIB_STR_NULL_SLACK
                while (dmax) { *dest = '\0'; dmax--; dest++; }
#else
                *dest = '\0';
#endif
                return RCNEGATE(EOK);
            }

            *dest = *src;
            if (*dest == '\0') {
#ifdef SAFECLIB_STR_NULL_SLACK
                /* null slack */
                while (dmax) { *dest = '\0'; dmax--; dest++; }
#endif
                return RCNEGATE(EOK);
            }

            dmax--;
            slen--;
            dest++;
            src++;
        }

    } else {
        overlap_bumper = dest;

        while (dmax > 0) {
            if (src == overlap_bumper) {
                handle_error(orig_dest, orig_dmax, "strncpy_s: "
                        "overlapping objects",
                        ESOVRLP);
                return RCNEGATE(ESOVRLP);
            }

	    if (slen == 0) {
                /*
                 * Copying truncated to slen chars.  Note that the TR says to
                 * copy slen chars plus the null char.  We null the slack.
                 */
#ifdef SAFECLIB_STR_NULL_SLACK
                while (dmax) { *dest = '\0'; dmax--; dest++; }
#else
                *dest = '\0';
#endif
                return RCNEGATE(EOK);
            }

            *dest = *src;
            if (*dest == '\0') {
#ifdef SAFECLIB_STR_NULL_SLACK
                /* null slack */
                while (dmax) { *dest = '\0'; dmax--; dest++; }
#endif
                return RCNEGATE(EOK);
            }

            dmax--;
            slen--;
            dest++;
            src++;
        }
    }

    /*
     * the entire src was not copied, so zero the string
     */
    handle_error(orig_dest, orig_dmax, "strncpy_s: not enough "
                 "space for src",
                 ESNOSPC);
    return RCNEGATE(ESNOSPC);
}